

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O0

bool __thiscall
Future<void>::Private::LockFreeQueue<Future<void>::Private::ThreadPool::Job>::pop
          (LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this,Job *result)

{
  Node *pNVar1;
  usize uVar2;
  ulong local_38;
  usize head;
  usize next;
  Node *node;
  Job *result_local;
  LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this_local;
  
  uVar2 = this->_head;
  do {
    local_38 = uVar2;
    pNVar1 = this->_queue + (local_38 & this->_capacityMask);
    if (pNVar1->head != local_38) {
      return false;
    }
    uVar2 = Atomic::compareAndSwap(&this->_head,local_38,local_38 + 1);
  } while (uVar2 != local_38);
  result->proc = (pNVar1->data).proc;
  result->args = (pNVar1->data).args;
  Atomic::swap(&pNVar1->tail,local_38 + this->_capacity);
  return true;
}

Assistant:

inline bool Future<void>::Private::LockFreeQueue<T>::pop(T &result)
{
  Node *node;
  usize next, head = _head;
  for (;; head = next)
  {
    node = &_queue[head & _capacityMask];
    if (node->head != head)
      return false;
    if ((next = Atomic::compareAndSwap(_head, head, head + 1)) == head)
      break;
  }
  result = node->data;
  (&node->data)->~T();
  Atomic::swap(node->tail, head + _capacity);
  return true;
}